

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceUBO::RunIteration
          (BasicResourceUBO *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  GLuint *pGVar6;
  CallLogWrapper *pCVar7;
  bool bVar8;
  bool bVar9;
  int i;
  GLuint GVar10;
  uint uVar11;
  long lVar12;
  ostream *poVar13;
  pointer pVVar14;
  uint uVar15;
  undefined7 in_register_00000009;
  ulong uVar16;
  bool *compile_error;
  long lVar17;
  ulong uVar18;
  GLuint i_1;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  uvec3 global_size;
  GLint p;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  int local_210 [3];
  undefined4 local_204;
  string local_200;
  GLuint *local_1e0;
  CallLogWrapper *local_1d8;
  float local_1d0 [4];
  long local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_204 = (undefined4)CONCAT71(in_register_00000009,dispatch_indirect);
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_210[2] = 0;
  local_210[0] = 0;
  local_210[1] = 0;
  lVar12 = 0;
  do {
    local_210[lVar12] = num_groups->m_data[lVar12] * param_1->m_data[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", local_size_y = ",0x11);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", local_size_z = ",0x11);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,");\nlayout(std140) uniform InputBuffer {\n  vec4 data[",0x34);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,"];\n} g_in_buffer[12];\nlayout(std430) buffer OutputBuffer {\n  vec4 data0[",
             0x48);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data1[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data2[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data3[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data4[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data5[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data6[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data7[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data8[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data9[",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data10[",0x11);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];\n  vec4 data11[",0x11);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,
             "];\n} g_out_buffer;\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = g_in_buffer[0].data[global_index];\n  g_out_buffer.data1[global_index] = g_in_buffer[1].data[global_index];\n  g_out_buffer.data2[global_index] = g_in_buffer[2].data[global_index];\n  g_out_buffer.data3[global_index] = g_in_buffer[3].data[global_index];\n  g_out_buffer.data4[global_index] = g_in_buffer[4].data[global_index];\n  g_out_buffer.data5[global_index] = g_in_buffer[5].data[global_index];\n  g_out_buffer.data6[global_index] = g_in_buffer[6].data[global_index];\n  g_out_buffer.data7[global_index] = g_in_buffer[7].data[global_index];\n  g_out_buffer.data8[global_index] = g_in_buffer[8].data[global_index];\n  g_out_buffer.data9[global_index] = g_in_buffer[9].data[global_index];\n  g_out_buffer.data10[global_index] = g_in_buffer[10].data[global_index];\n  g_out_buffer.data11[global_index] = g_in_buffer[11].data[global_index];\n}"
             ,0x457);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar10 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_200);
  this->m_program = GVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_200._M_dataplus._M_p._4_4_,(int)local_200._M_dataplus._M_p) !=
      &local_200.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_200._M_dataplus._M_p._4_4_,(int)local_200._M_dataplus._M_p),
                    local_200.field_2._M_allocated_capacity + 1);
  }
  local_1d8 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(local_1d8,this->m_program);
  bVar9 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  pCVar7 = local_1d8;
  bVar22 = false;
  if (bVar9) {
    bVar22 = false;
    uVar18 = 0;
    do {
      uVar19 = (uint)uVar18;
      sprintf(local_1b8,"InputBuffer[%u]",uVar18);
      GVar10 = glu::CallLogWrapper::glGetUniformBlockIndex(pCVar7,this->m_program,local_1b8);
      glu::CallLogWrapper::glUniformBlockBinding(pCVar7,this->m_program,GVar10,uVar19);
      local_200._M_dataplus._M_p._0_4_ = 0;
      glu::CallLogWrapper::glGetActiveUniformBlockiv
                (pCVar7,this->m_program,GVar10,0x90ec,(GLint *)&local_200);
      if ((int)local_200._M_dataplus._M_p == 0) {
        anon_unknown_0::Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
        if (!bVar22) {
          return false;
        }
        break;
      }
      bVar22 = 10 < uVar19;
      uVar18 = (ulong)(uVar19 + 1);
    } while (uVar19 + 1 != 0xc);
    pCVar7 = local_1d8;
    uVar19 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
             * param_1->m_data[2] * num_groups->m_data[2];
    uVar18 = (ulong)uVar19;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(local_1d8,1,&this->m_storage_buffer);
    }
    local_1e0 = &this->m_storage_buffer;
    glu::CallLogWrapper::glBindBufferBase(pCVar7,0x90d2,0,this->m_storage_buffer);
    local_1c0 = uVar18 * 0xc0;
    glu::CallLogWrapper::glBufferData(pCVar7,0x90d2,local_1c0,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(pCVar7,0x90d2,0);
    if (this->m_uniform_buffer[0] == 0) {
      glu::CallLogWrapper::glGenBuffers(pCVar7,0xc,this->m_uniform_buffer);
    }
    lVar12 = 0;
    do {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8
                 ,uVar18,(allocator_type *)&local_200);
      if (uVar19 != 0) {
        uVar16 = 0;
        do {
          lVar17 = 0;
          do {
            *(float *)((long)&local_200._M_dataplus._M_p + lVar17 * 4) =
                 (float)(uVar19 * (GLuint)lVar12 + (int)uVar16);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          *(ulong *)((pointer)(local_1b8._0_8_ + uVar16 * 0x10))->m_data =
               CONCAT44(local_200._M_dataplus._M_p._4_4_,(int)local_200._M_dataplus._M_p);
          *(size_type *)(((pointer)(local_1b8._0_8_ + uVar16 * 0x10))->m_data + 2) =
               local_200._M_string_length;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar18);
      }
      glu::CallLogWrapper::glBindBufferBase
                (pCVar7,0x8a11,(GLuint)lVar12,this->m_uniform_buffer[lVar12]);
      glu::CallLogWrapper::glBufferData(pCVar7,0x8a11,uVar18 << 4,(void *)local_1b8._0_8_,0x88e8);
      if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xc);
    glu::CallLogWrapper::glBindBuffer(pCVar7,0x8a11,0);
    glu::CallLogWrapper::glUseProgram(pCVar7,this->m_program);
    if ((char)local_204 == '\0') {
      glu::CallLogWrapper::glDispatchCompute
                (pCVar7,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(pCVar7,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(pCVar7,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(pCVar7,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(pCVar7,0);
    }
    pGVar6 = local_1e0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8,
               (ulong)(uVar19 * 0xc),(allocator_type *)&local_200);
    glu::CallLogWrapper::glBindBuffer(pCVar7,0x90d2,*pGVar6);
    glu::CallLogWrapper::glMemoryBarrier(pCVar7,0x200);
    glu::CallLogWrapper::glGetBufferSubData(pCVar7,0x90d2,0,local_1c0,(void *)local_1b8._0_8_);
    bVar22 = num_groups->m_data[2] * param_1->m_data[2] == 0;
    if (!bVar22) {
      uVar19 = 0;
      do {
        bVar9 = num_groups->m_data[1] * param_1->m_data[1] != 0;
        if (bVar9) {
          uVar20 = 0;
          do {
            uVar15 = param_1->m_data[0];
            uVar11 = num_groups->m_data[0];
            if (uVar11 * uVar15 != 0) {
              uVar21 = 0;
              do {
                uVar18 = (ulong)(((param_1->m_data[1] * uVar19 * num_groups->m_data[1] + uVar20) *
                                  uVar11 * uVar15 + uVar21) * 0xc);
                pVVar14 = (pointer)(local_1b8._0_8_ + uVar18 * 0x10);
                bVar8 = true;
                while( true ) {
                  bVar5 = bVar8;
                  if (!bVar5) goto LAB_00920baf;
                  fVar1 = pVVar14->m_data[0];
                  fVar2 = pVVar14->m_data[1];
                  fVar3 = pVVar14->m_data[2];
                  fVar4 = pVVar14->m_data[3];
                  lVar12 = 0;
                  do {
                    local_1d0[lVar12] = (float)uVar18;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 4);
                  if (((((fVar1 != local_1d0[0]) || (NAN(fVar1) || NAN(local_1d0[0]))) ||
                       (fVar2 != local_1d0[1])) ||
                      ((NAN(fVar2) || NAN(local_1d0[1]) || (fVar3 != local_1d0[2])))) ||
                     (NAN(fVar3) || NAN(local_1d0[2]))) break;
                  if ((fVar4 != local_1d0[3]) || (bVar8 = false, NAN(fVar4) || NAN(local_1d0[3])))
                  break;
                }
                anon_unknown_0::Output("Incorrect data at offset %d.\n");
                if (bVar5) {
                  if (!bVar9) goto LAB_00920be4;
                  goto LAB_00920bff;
                }
LAB_00920baf:
                uVar21 = uVar21 + 1;
                uVar15 = param_1->m_data[0];
                uVar11 = num_groups->m_data[0];
              } while (uVar21 < uVar11 * uVar15);
            }
            uVar20 = uVar20 + 1;
            bVar9 = uVar20 < num_groups->m_data[1] * param_1->m_data[1];
          } while (bVar9);
        }
LAB_00920be4:
        uVar19 = uVar19 + 1;
        bVar9 = uVar19 < num_groups->m_data[2] * param_1->m_data[2];
        bVar22 = !bVar9;
      } while (bVar9);
    }
LAB_00920bff:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  return bVar22;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		for (GLuint i = 0; i < 12; ++i)
		{
			char name[32];
			sprintf(name, "InputBuffer[%u]", i);
			const GLuint index = glGetUniformBlockIndex(m_program, name);
			glUniformBlockBinding(m_program, index, i);
			GLint p = 0;
			glGetActiveUniformBlockiv(m_program, index, GL_UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER, &p);
			if (p == GL_FALSE)
			{
				Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
				return false;
			}
		}

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 12, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_uniform_buffer[0] == 0)
			glGenBuffers(12, m_uniform_buffer);
		for (GLuint i = 0; i < 12; ++i)
		{
			std::vector<vec4> data(kBufferSize);
			for (GLuint j = 0; j < kBufferSize; ++j)
			{
				data[j] = vec4(static_cast<float>(i * kBufferSize + j));
			}
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		}
		glBindBuffer(GL_UNIFORM_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		std::vector<vec4> data(kBufferSize * 12);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 12, &data[0]);

		for (GLuint z = 0; z < local_size.z() * num_groups.z(); ++z)
		{
			for (GLuint y = 0; y < local_size.y() * num_groups.y(); ++y)
			{
				for (GLuint x = 0; x < local_size.x() * num_groups.x(); ++x)
				{
					const GLuint index = z * local_size.x() * num_groups.x() * local_size.y() * num_groups.y() +
										 y * local_size.x() * num_groups.x() + x;
					for (int i = 0; i < 1; ++i)
					{
						if (!IsEqual(data[index * 12 + i], vec4(static_cast<float>(index * 12 + i))))
						{
							Output("Incorrect data at offset %d.\n", index * 12 + i);
							return false;
						}
					}
				}
			}
		}
		return true;
	}